

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::
LineSegmentsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
::operator()(LineSegmentsRenderer<ImPlot::GetterYs<unsigned_char>,_ImPlot::GetterYRef,_ImPlot::TransformerLinLin>
             *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  ImVec2 IVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  ImU32 IVar5;
  uint uVar6;
  GetterYs<unsigned_char> *pGVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  undefined1 auVar11 [16];
  ulong uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  int iVar16;
  ImPlotContext *gp;
  ImDrawIdx IVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  double dVar22;
  double dVar23;
  ulong uVar24;
  float fVar25;
  float fVar26;
  float fVar32;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  
  pGVar7 = this->Getter1;
  pGVar8 = this->Getter2;
  iVar16 = pGVar7->Count;
  iVar4 = this->Transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar4].Min;
  dVar22 = (double)IVar1.x;
  dVar23 = (double)IVar1.y;
  dVar2 = GImPlot->CurrentPlot->YAxis[iVar4].Range.Min;
  dVar3 = (GImPlot->CurrentPlot->XAxis).Range.Min;
  fVar18 = (float)(((double)pGVar7->Ys
                            [(long)(((prim + pGVar7->Offset) % iVar16 + iVar16) % iVar16) *
                             (long)pGVar7->Stride] - dVar2) * GImPlot->My[iVar4] + dVar23);
  fVar19 = (float)(((pGVar7->XScale * (double)prim + pGVar7->X0) - dVar3) * GImPlot->Mx + dVar22);
  dVar22 = (((double)prim * pGVar8->XScale + pGVar8->X0) - dVar3) * GImPlot->Mx + dVar22;
  fVar20 = (float)((pGVar8->YRef - dVar2) * GImPlot->My[iVar4] + dVar23);
  fVar21 = (float)dVar22;
  uVar24 = CONCAT44(-(uint)(fVar21 <= fVar19),-(uint)(fVar20 <= fVar18));
  auVar13._4_8_ = dVar22;
  auVar13._0_4_ = fVar19;
  auVar27._0_8_ = auVar13._0_8_ << 0x20;
  auVar27._8_4_ = fVar18;
  auVar27._12_4_ = fVar19;
  auVar14._4_8_ = auVar27._8_8_;
  auVar14._0_4_ = -(uint)(fVar19 < fVar21);
  auVar28._0_8_ = auVar14._0_8_ << 0x20;
  auVar28._8_4_ = -(uint)(fVar18 < fVar20);
  auVar28._12_4_ = -(uint)(fVar19 < fVar21);
  uVar12 = CONCAT44(fVar19,fVar18) & auVar28._8_8_;
  auVar29._0_8_ = ~uVar24 & CONCAT44(fVar21,fVar20);
  auVar29._8_8_ = ~auVar28._8_8_ & CONCAT44(fVar21,fVar20);
  auVar11._8_4_ = (int)uVar12;
  auVar11._0_8_ = CONCAT44(fVar19,fVar18) & uVar24;
  auVar11._12_4_ = (int)(uVar12 >> 0x20);
  auVar29 = auVar29 | auVar11;
  fVar32 = (cull_rect->Min).x;
  auVar31._4_4_ = -(uint)(fVar32 < auVar29._4_4_);
  auVar31._0_4_ = -(uint)((cull_rect->Min).y < auVar29._0_4_);
  auVar15._4_8_ = auVar29._8_8_;
  auVar15._0_4_ = -(uint)(auVar29._4_4_ < fVar32);
  auVar30._0_8_ = auVar15._0_8_ << 0x20;
  auVar30._8_4_ = -(uint)(auVar29._8_4_ < (cull_rect->Max).y);
  auVar30._12_4_ = -(uint)(auVar29._12_4_ < (cull_rect->Max).x);
  auVar31._8_8_ = auVar30._8_8_;
  iVar16 = movmskps((int)GImPlot,auVar31);
  if (iVar16 == 0xf) {
    IVar5 = this->Col;
    IVar1 = *uv;
    fVar25 = fVar20 - fVar18;
    fVar32 = fVar21 - fVar19;
    fVar26 = fVar32 * fVar32 + fVar25 * fVar25;
    if (0.0 < fVar26) {
      fVar26 = 1.0 / SQRT(fVar26);
      fVar32 = fVar32 * fVar26;
      fVar25 = fVar25 * fVar26;
    }
    fVar26 = this->Weight * 0.5;
    pIVar9 = DrawList->_VtxWritePtr;
    fVar32 = fVar26 * fVar32;
    fVar26 = fVar26 * fVar25;
    (pIVar9->pos).x = fVar26 + fVar19;
    (pIVar9->pos).y = fVar18 - fVar32;
    (pIVar9->uv).x = IVar1.x;
    (pIVar9->uv).y = IVar1.y;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = IVar5;
    pIVar9[1].pos.x = fVar26 + fVar21;
    pIVar9[1].pos.y = fVar20 - fVar32;
    pIVar9[1].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = IVar5;
    pIVar9[2].pos.x = fVar21 - fVar26;
    pIVar9[2].pos.y = fVar32 + fVar20;
    pIVar9[2].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = IVar5;
    pIVar9[3].pos.x = fVar19 - fVar26;
    pIVar9[3].pos.y = fVar32 + fVar18;
    pIVar9[3].uv = IVar1;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = IVar5;
    DrawList->_VtxWritePtr = pIVar9 + 4;
    uVar6 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar17 = (ImDrawIdx)uVar6;
    *pIVar10 = IVar17;
    pIVar10[1] = IVar17 + 1;
    pIVar10[2] = IVar17 + 2;
    pIVar10[3] = IVar17;
    pIVar10[4] = IVar17 + 2;
    pIVar10[5] = IVar17 + 3;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar6 + 4;
  }
  return (char)iVar16 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P1 = Transformer(Getter1(prim));
        ImVec2 P2 = Transformer(Getter2(prim));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2))))
            return false;
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        return true;
    }